

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

size_t __thiscall efsw::String::find_last_of(String *this,char *s,size_t pos,size_t n)

{
  size_type sVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_38;
  
  String((String *)&local_38,s);
  sVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
          find_last_of(&this->mString,&local_38,pos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return sVar1;
}

Assistant:

std::size_t String::find_last_of( const char* s, std::size_t pos, std::size_t n ) const {
	return find_last_of( String( s ), pos );
}